

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peglib.h
# Opt level: O1

void __thiscall
peg::CharacterClass::CharacterClass(CharacterClass *this,string *s,bool negated,bool ignore_case)

{
  int iVar1;
  int iVar2;
  undefined7 in_register_00000009;
  ulong uVar3;
  u32string chars;
  pair<char32_t,_char32_t> local_48;
  u32string local_40;
  
  (this->super_enable_shared_from_this<peg::CharacterClass>)._M_weak_this.
  super___weak_ptr<peg::CharacterClass,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<peg::CharacterClass>)._M_weak_this.
  super___weak_ptr<peg::CharacterClass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Ope)._vptr_Ope = (_func_int **)&PTR__CharacterClass_00171ea8;
  (this->ranges_).
  super__Vector_base<std::pair<char32_t,_char32_t>,_std::allocator<std::pair<char32_t,_char32_t>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ranges_).
  super__Vector_base<std::pair<char32_t,_char32_t>,_std::allocator<std::pair<char32_t,_char32_t>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ranges_).
  super__Vector_base<std::pair<char32_t,_char32_t>,_std::allocator<std::pair<char32_t,_char32_t>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->negated_ = negated;
  this->ignore_case_ = ignore_case;
  decode_abi_cxx11_(&local_40,(peg *)(s->_M_dataplus)._M_p,(char *)s->_M_string_length,
                    CONCAT71(in_register_00000009,ignore_case));
  if (local_40._M_string_length != 0) {
    uVar3 = 0;
    do {
      iVar1 = (int)uVar3;
      if ((iVar1 + 2 < local_40._M_string_length) && (local_40._M_dataplus._M_p[iVar1 + 1] == L'-'))
      {
        local_48.first = local_40._M_dataplus._M_p[uVar3];
        local_48.second = local_40._M_dataplus._M_p[iVar1 + 2];
        std::vector<std::pair<char32_t,char32_t>,std::allocator<std::pair<char32_t,char32_t>>>::
        emplace_back<std::pair<char32_t,char32_t>>
                  ((vector<std::pair<char32_t,char32_t>,std::allocator<std::pair<char32_t,char32_t>>>
                    *)&this->ranges_,&local_48);
        iVar2 = 3;
      }
      else {
        local_48.first = local_40._M_dataplus._M_p[uVar3];
        local_48.second = local_48.first;
        std::vector<std::pair<char32_t,char32_t>,std::allocator<std::pair<char32_t,char32_t>>>::
        emplace_back<std::pair<char32_t,char32_t>>
                  ((vector<std::pair<char32_t,char32_t>,std::allocator<std::pair<char32_t,char32_t>>>
                    *)&this->ranges_,&local_48);
        iVar2 = 1;
      }
      uVar3 = (ulong)(uint)(iVar1 + iVar2);
    } while (uVar3 < local_40._M_string_length);
  }
  if ((this->ranges_).
      super__Vector_base<std::pair<char32_t,_char32_t>,_std::allocator<std::pair<char32_t,_char32_t>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->ranges_).
      super__Vector_base<std::pair<char32_t,_char32_t>,_std::allocator<std::pair<char32_t,_char32_t>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 4 + 4);
    }
    return;
  }
  __assert_fail("!ranges_.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/yhirose[P]culebra/./vendor/cpp-peglib/peglib.h"
                ,0x4ba,"peg::CharacterClass::CharacterClass(const std::string &, bool, bool)");
}

Assistant:

CharacterClass(const std::string &s, bool negated, bool ignore_case)
      : negated_(negated), ignore_case_(ignore_case) {
    auto chars = decode(s.data(), s.length());
    auto i = 0u;
    while (i < chars.size()) {
      if (i + 2 < chars.size() && chars[i + 1] == '-') {
        auto cp1 = chars[i];
        auto cp2 = chars[i + 2];
        ranges_.emplace_back(std::pair(cp1, cp2));
        i += 3;
      } else {
        auto cp = chars[i];
        ranges_.emplace_back(std::pair(cp, cp));
        i += 1;
      }
    }
    assert(!ranges_.empty());
  }